

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluObjectWrapper.cpp
# Opt level: O0

void __thiscall glu::ObjectVector::resize(ObjectVector *this,size_t newSize)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  value_type_conflict2 local_24;
  size_type local_20;
  size_t oldSize;
  size_t newSize_local;
  ObjectVector *this_local;
  
  oldSize = newSize;
  newSize_local = (size_t)this;
  local_20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_objects);
  if (oldSize == 0) {
    clear(this);
  }
  if (local_20 < oldSize) {
    local_24 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_objects,oldSize,&local_24);
    pcVar1 = *(code **)((long)&this->m_gl->activeShaderProgram + this->m_traits->genFunc);
    iVar3 = (int)local_20;
    iVar2 = (int)oldSize;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_objects,local_20);
    (*pcVar1)(iVar2 - iVar3,pvVar4);
  }
  else if (oldSize < local_20) {
    pcVar1 = *(code **)((long)&this->m_gl->activeShaderProgram + this->m_traits->deleteFunc);
    iVar3 = (int)oldSize;
    iVar2 = (int)local_20;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_objects,oldSize);
    (*pcVar1)(iVar2 - iVar3,pvVar4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_objects,oldSize);
  }
  return;
}

Assistant:

void ObjectVector::resize (size_t newSize)
{
	const size_t oldSize = m_objects.size();

	if (newSize == 0)
	{
		clear(); // Avoid size_t (unsigned) overflow issues in delete path.
	}
	if (oldSize < newSize)
	{
		m_objects.resize(newSize, 0);
		(m_gl.*m_traits.genFunc)(glw::GLsizei(newSize - oldSize), &m_objects[oldSize]);
	}
	else if (oldSize > newSize)
	{
		(m_gl.*m_traits.deleteFunc)(glw::GLsizei(oldSize - newSize), &m_objects[newSize]);
		m_objects.resize(newSize);
	}
}